

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ping.cpp
# Opt level: O2

void configure_parser(Parser *parser)

{
  allocator local_8c;
  allocator local_8b;
  allocator local_8a;
  allocator local_89;
  string local_88;
  string local_68;
  string local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  std::__cxx11::string::string((string *)&local_48,"o",&local_8a);
  std::__cxx11::string::string((string *)&local_68,"output",&local_8b);
  std::__cxx11::string::string((string *)&local_28,"/tmp/__test/chr",&local_8c);
  std::__cxx11::string::string((string *)&local_88,"Output chronicle path",&local_89);
  cli::Parser::set_optional<std::__cxx11::string>(parser,&local_48,&local_68,&local_28,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"n",&local_8a);
  std::__cxx11::string::string((string *)&local_68,"max-count",&local_8b);
  std::__cxx11::string::string((string *)&local_88,"Number of entries written",&local_8c);
  cli::Parser::set_optional<unsigned_long>(parser,&local_48,&local_68,10000000,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"w",&local_8a);
  std::__cxx11::string::string((string *)&local_68,"writer-threads",&local_8b);
  std::__cxx11::string::string((string *)&local_88,"Number of writer threads",&local_8c);
  cli::Parser::set_optional<unsigned_long>(parser,&local_48,&local_68,4,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"x",&local_8a);
  std::__cxx11::string::string((string *)&local_68,"delete",&local_8b);
  std::__cxx11::string::string
            ((string *)&local_88,"Delete the input chronicle at startup",&local_8c);
  cli::Parser::set_optional<bool>(parser,&local_48,&local_68,false,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void configure_parser(cli::Parser & parser)
{
    parser.set_optional<std::string>("o", "output", "/tmp/__test/chr", "Output chronicle path");
    parser.set_optional<std::size_t>("n", "max-count", 10000000, "Number of entries written");
    parser.set_optional<std::size_t>("w", "writer-threads", 4, "Number of writer threads");
    parser.set_optional<bool>("x", "delete", false, "Delete the input chronicle at startup");
}